

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_linetype.cpp
# Opt level: O1

bool __thiscall ON_Linetype::SetSegment(ON_Linetype *this,int index,ON_LinetypeSegment *segment)

{
  ON_LinetypeSegment *pOVar1;
  eSegType eVar2;
  uint uVar3;
  bool bVar4;
  
  bVar4 = false;
  if ((-1 < index) && ((this->m_is_locked_bits & 1) == 0)) {
    if ((this->m_private->m_segments).m_count <= index) {
      return false;
    }
    eVar2 = segment->m_seg_type;
    uVar3 = segment->m_reserved2;
    pOVar1 = (this->m_private->m_segments).m_a + (uint)index;
    pOVar1->m_length = segment->m_length;
    pOVar1->m_seg_type = eVar2;
    pOVar1->m_reserved2 = uVar3;
    bVar4 = true;
  }
  return bVar4;
}

Assistant:

bool ON_Linetype::SetSegment( int index, const ON_LinetypeSegment& segment)
{
  if (PatternIsLocked())
    return false;

  if( index >= 0 && index < m_private->m_segments.Count())
  {
    m_private->m_segments[index] = segment;
    return true;
  }
  else
    return false;
}